

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_datarate_test.cc
# Opt level: O1

void __thiscall
datarate_test::anon_unknown_0::DatarateTestSVC::BasicRateTargetingSVC3TL3SLIntraMidSeqDecodeAll
          (DatarateTestSVC *this)

{
  double *val1;
  bool bVar1;
  uint uVar2;
  ParamType *pPVar3;
  uint uVar4;
  undefined8 *puVar5;
  pointer *__ptr;
  SEARCH_METHODS *pSVar6;
  long lVar7;
  long lVar8;
  AssertHelper local_c8;
  AssertHelper local_c0;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  I420VideoSource video;
  
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_optimal_sz = 500;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_sz = 1000;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_initial_sz = 500;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_min_quantizer = 0;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_max_quantizer = 0x38;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_end_usage = AOM_CBR;
  (this->super_DatarateTest).super_EncoderTest.cfg_.g_lag_in_frames = 0;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_dropframe_thresh = 0;
  (this->super_DatarateTest).super_EncoderTest.cfg_.g_error_resilient = 0;
  gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
  _vptr_TestPartResultReporterInterface =
       (_func_int **)&gtest_fatal_failure_checker.original_reporter_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gtest_fatal_failure_checker,"hantro_collage_w352h288.yuv","");
  libaom_test::YUVVideoSource::YUVVideoSource
            (&video.super_YUVVideoSource,(string *)&gtest_fatal_failure_checker,AOM_IMG_FMT_I420,
             0x160,0x120,0x1e,1,0,300);
  video.super_YUVVideoSource.super_VideoSource._vptr_VideoSource =
       (_func_int **)&PTR__YUVVideoSource_01044d00;
  if ((TestPartResultReporterInterface **)
      gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
      _vptr_TestPartResultReporterInterface != &gtest_fatal_failure_checker.original_reporter_) {
    operator_delete(gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                    _vptr_TestPartResultReporterInterface);
  }
  pPVar3 = testing::
           WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
           ::GetParam();
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate =
       *(uint *)(&DAT_00c826f8 +
                (long)(pPVar3->
                      super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>
                      ).super__Tuple_impl<1UL,_libaom_test::TestMode,_int,_unsigned_int,_int>.
                      super__Tuple_impl<2UL,_int,_unsigned_int,_int>.
                      super__Tuple_impl<3UL,_unsigned_int,_int>.super__Tuple_impl<4UL,_int>.
                      super__Head_base<4UL,_int,_false>._M_head_impl * 4);
  (*(this->super_CodecTestWith4Params<libaom_test::TestMode,_int,_unsigned_int,_int>).
    super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
    .super_Test._vptr_Test[8])(this);
  this->intra_only_ = 1;
  this->frame_sync_ = 0x14;
  this->frame_to_start_decoding_ = 0;
  this->layer_to_decode_ = 3;
  this->number_temporal_layers_ = 3;
  this->number_spatial_layers_ = 3;
  uVar2 = (this->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate;
  this->target_layer_bitrate_[0] = uVar2 >> 4;
  this->target_layer_bitrate_[1] = ((uVar2 >> 3) * 0x46) / 100;
  this->target_layer_bitrate_[2] = uVar2 >> 3;
  uVar4 = uVar2 * 3 >> 3;
  this->target_layer_bitrate_[3] = uVar2 * 3 >> 4;
  this->target_layer_bitrate_[4] = (uVar4 * 0x46) / 100;
  this->target_layer_bitrate_[5] = uVar4;
  uVar2 = uVar2 >> 1 & 0x1fffffff;
  this->target_layer_bitrate_[6] = uVar2 >> 1;
  this->target_layer_bitrate_[7] = (uVar2 * 0x46) / 100;
  this->target_layer_bitrate_[8] = uVar2;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      (*(this->super_DatarateTest).super_EncoderTest._vptr_EncoderTest[2])
                (&this->super_DatarateTest,&video);
    }
    bVar1 = gtest_fatal_failure_checker.has_new_fatal_failure_;
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    if (bVar1 == false) {
      if (0 < this->number_spatial_layers_ * this->number_temporal_layers_) {
        lVar7 = 0;
        lVar8 = 0;
        do {
          val1 = (double *)((long)this->effective_datarate_tl + lVar7);
          local_c8.data_ = (AssertHelperData *)((double)this->target_layer_bitrate_[lVar8] * 0.585);
          testing::internal::CmpHelperGE<double,double>
                    ((internal *)&gtest_fatal_failure_checker,"effective_datarate_tl[i]",
                     "target_layer_bitrate_[i] * 0.585",val1,(double *)&local_c8);
          if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                    _vptr_TestPartResultReporterInterface == '\0') {
            testing::Message::Message((Message *)&local_c8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&(local_c8.data_)->line,
                       " The datarate for the file is lower than target by too much!",0x3c);
            if ((undefined8 *)
                CONCAT71(gtest_fatal_failure_checker._9_7_,
                         gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0) {
              pSVar6 = "";
            }
            else {
              pSVar6 = *(SEARCH_METHODS **)
                        CONCAT71(gtest_fatal_failure_checker._9_7_,
                                 gtest_fatal_failure_checker.has_new_fatal_failure_);
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_c0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/svc_datarate_test.cc"
                       ,0x636,(char *)pSVar6);
            testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
            testing::internal::AssertHelper::~AssertHelper(&local_c0);
            if (local_c8.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_c8.data_ + 8))();
            }
            puVar5 = (undefined8 *)
                     CONCAT71(gtest_fatal_failure_checker._9_7_,
                              gtest_fatal_failure_checker.has_new_fatal_failure_);
            if (puVar5 == (undefined8 *)0x0) goto LAB_0062981c;
            if ((undefined8 *)*puVar5 != puVar5 + 2) {
              operator_delete((undefined8 *)*puVar5);
            }
            goto LAB_00629814;
          }
          puVar5 = (undefined8 *)
                   CONCAT71(gtest_fatal_failure_checker._9_7_,
                            gtest_fatal_failure_checker.has_new_fatal_failure_);
          if (puVar5 != (undefined8 *)0x0) {
            if ((undefined8 *)*puVar5 != puVar5 + 2) {
              operator_delete((undefined8 *)*puVar5);
            }
            operator_delete(puVar5);
          }
          local_c8.data_ = (AssertHelperData *)((double)this->target_layer_bitrate_[lVar8] * 1.6);
          testing::internal::CmpHelperLE<double,double>
                    ((internal *)&gtest_fatal_failure_checker,"effective_datarate_tl[i]",
                     "target_layer_bitrate_[i] * 1.60",val1,(double *)&local_c8);
          if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                    _vptr_TestPartResultReporterInterface == '\0') {
            testing::Message::Message((Message *)&local_c8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&(local_c8.data_)->line,
                       " The datarate for the file is greater than target by too much!",0x3e);
            if ((undefined8 *)
                CONCAT71(gtest_fatal_failure_checker._9_7_,
                         gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0) {
              pSVar6 = "";
            }
            else {
              pSVar6 = *(SEARCH_METHODS **)
                        CONCAT71(gtest_fatal_failure_checker._9_7_,
                                 gtest_fatal_failure_checker.has_new_fatal_failure_);
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_c0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/svc_datarate_test.cc"
                       ,0x638,(char *)pSVar6);
            testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
            testing::internal::AssertHelper::~AssertHelper(&local_c0);
            if (local_c8.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_c8.data_ + 8))();
            }
            puVar5 = (undefined8 *)
                     CONCAT71(gtest_fatal_failure_checker._9_7_,
                              gtest_fatal_failure_checker.has_new_fatal_failure_);
            if (puVar5 == (undefined8 *)0x0) goto LAB_0062981c;
            if ((undefined8 *)*puVar5 != puVar5 + 2) {
              operator_delete((undefined8 *)*puVar5);
            }
            goto LAB_00629814;
          }
          puVar5 = (undefined8 *)
                   CONCAT71(gtest_fatal_failure_checker._9_7_,
                            gtest_fatal_failure_checker.has_new_fatal_failure_);
          if (puVar5 != (undefined8 *)0x0) {
            if ((undefined8 *)*puVar5 != puVar5 + 2) {
              operator_delete((undefined8 *)*puVar5);
            }
            operator_delete(puVar5);
          }
          lVar8 = lVar8 + 1;
          lVar7 = lVar7 + 8;
        } while (lVar8 < (long)this->number_spatial_layers_ * (long)this->number_temporal_layers_);
      }
      local_c8.data_._0_4_ = this->mismatch_nframes_;
      local_c0.data_._0_4_ = 0x96;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_fatal_failure_checker,"(int)GetMismatchFrames()","150",
                 (int *)&local_c8,(int *)&local_c0);
      if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                _vptr_TestPartResultReporterInterface == '\0') {
        testing::Message::Message((Message *)&local_c8);
        if ((undefined8 *)
            CONCAT71(gtest_fatal_failure_checker._9_7_,
                     gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0) {
          pSVar6 = "";
        }
        else {
          pSVar6 = *(SEARCH_METHODS **)
                    CONCAT71(gtest_fatal_failure_checker._9_7_,
                             gtest_fatal_failure_checker.has_new_fatal_failure_);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/svc_datarate_test.cc"
                   ,0x63e,(char *)pSVar6);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if (local_c8.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_c8.data_ + 8))();
        }
      }
      puVar5 = (undefined8 *)
               CONCAT71(gtest_fatal_failure_checker._9_7_,
                        gtest_fatal_failure_checker.has_new_fatal_failure_);
      if (puVar5 != (undefined8 *)0x0) {
        if ((undefined8 *)*puVar5 != puVar5 + 2) {
          operator_delete((undefined8 *)*puVar5);
        }
LAB_00629814:
        operator_delete(puVar5);
      }
      goto LAB_0062981c;
    }
  }
  testing::Message::Message((Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::AssertHelper
            (&local_c8,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/svc_datarate_test.cc"
             ,0x634,
             "Expected: RunLoop(&video) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
            );
  testing::internal::AssertHelper::operator=(&local_c8,(Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::~AssertHelper(&local_c8);
  if (gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
      _vptr_TestPartResultReporterInterface != (_func_int **)0x0) {
    (**(code **)(*gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                  _vptr_TestPartResultReporterInterface + 8))();
  }
LAB_0062981c:
  libaom_test::YUVVideoSource::~YUVVideoSource(&video.super_YUVVideoSource);
  return;
}

Assistant:

virtual void BasicRateTargetingSVC3TL3SLIntraMidSeqDecodeAll() {
    cfg_.rc_buf_initial_sz = 500;
    cfg_.rc_buf_optimal_sz = 500;
    cfg_.rc_buf_sz = 1000;
    cfg_.rc_dropframe_thresh = 0;
    cfg_.rc_min_quantizer = 0;
    cfg_.rc_max_quantizer = 56;
    cfg_.rc_end_usage = AOM_CBR;
    cfg_.g_lag_in_frames = 0;
    cfg_.g_error_resilient = 0;
    ::libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352,
                                         288, 30, 1, 0, 300);
    const int bitrate_array[2] = { 500, 1000 };
    cfg_.rc_target_bitrate = bitrate_array[GET_PARAM(4)];
    ResetModel();
    intra_only_ = 1;
    frame_sync_ = 20;
    frame_to_start_decoding_ = 0;
    layer_to_decode_ = 3;
    number_temporal_layers_ = 3;
    number_spatial_layers_ = 3;
    // SL0
    const int bitrate_sl0 = 1 * cfg_.rc_target_bitrate / 8;
    target_layer_bitrate_[0] = 50 * bitrate_sl0 / 100;
    target_layer_bitrate_[1] = 70 * bitrate_sl0 / 100;
    target_layer_bitrate_[2] = bitrate_sl0;
    // SL1
    const int bitrate_sl1 = 3 * cfg_.rc_target_bitrate / 8;
    target_layer_bitrate_[3] = 50 * bitrate_sl1 / 100;
    target_layer_bitrate_[4] = 70 * bitrate_sl1 / 100;
    target_layer_bitrate_[5] = bitrate_sl1;
    // SL2
    const int bitrate_sl2 = 4 * cfg_.rc_target_bitrate / 8;
    target_layer_bitrate_[6] = 50 * bitrate_sl2 / 100;
    target_layer_bitrate_[7] = 70 * bitrate_sl2 / 100;
    target_layer_bitrate_[8] = bitrate_sl2;
    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
    for (int i = 0; i < number_temporal_layers_ * number_spatial_layers_; i++) {
      ASSERT_GE(effective_datarate_tl[i], target_layer_bitrate_[i] * 0.585)
          << " The datarate for the file is lower than target by too much!";
      ASSERT_LE(effective_datarate_tl[i], target_layer_bitrate_[i] * 1.60)
          << " The datarate for the file is greater than target by too much!";
    }
#if CONFIG_AV1_DECODER
    // All 3 spatial layers are decoded, starting at frame 0, so there are
    // and there 300/2 = 150 non-reference frames, so mismatch is 150.
    EXPECT_EQ((int)GetMismatchFrames(), 150);
#endif
  }